

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_add_diagonal_block
               (Integer g_a,void *ptr,Integer g_v,Integer *loA,Integer *hiA,Integer ld,Integer type)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Integer IVar5;
  void *__ptr;
  long *in_RCX;
  long in_RSI;
  long *in_R8;
  long in_R9;
  Integer in_stack_00000008;
  SingleComplex *fca;
  DoubleComplex *dca;
  long *la;
  double *da;
  float *fa;
  int *ia;
  void *buf;
  Integer i;
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_000000a0;
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  Integer vhi;
  Integer vlo;
  Integer size;
  Integer nelem;
  long local_108;
  long local_100;
  long local_e8;
  float *local_d8;
  double *local_d0;
  long *local_c8;
  double *local_c0;
  float *local_b8;
  int *local_b0;
  long local_a0;
  
  lVar1 = *in_RCX;
  lVar2 = *in_R8;
  lVar3 = in_RCX[1];
  local_108 = in_R8[1];
  if (0 < lVar1) {
    local_e8 = lVar3;
    if (lVar3 <= lVar1) {
      local_e8 = lVar1;
    }
    lVar4 = local_108;
    if (lVar2 <= local_108) {
      lVar4 = lVar2;
    }
    if (local_e8 <= lVar4) {
      IVar5 = GAsizeof(in_stack_00000008);
      local_100 = lVar3;
      if (lVar3 <= lVar1) {
        local_100 = lVar1;
      }
      if (lVar2 <= local_108) {
        local_108 = lVar2;
      }
      __ptr = malloc(((local_108 - local_100) + 1) * IVar5);
      if (__ptr == (void *)0x0) {
        pnga_error((char *)lo[0],hi[1]);
      }
      pnga_get(iloA,(Integer *)ihiA,(Integer *)jloA,(void *)jhiA,in_stack_000000a0);
      switch(in_stack_00000008) {
      case 0x3e9:
        local_b0 = (int *)(((in_R9 * (local_e8 - lVar3) + local_e8) - lVar1) * 4 + in_RSI);
        for (local_a0 = 0; local_a0 < (lVar4 - local_e8) + 1; local_a0 = local_a0 + 1) {
          *local_b0 = *(int *)((long)__ptr + local_a0 * 4) + *local_b0;
          local_b0 = local_b0 + in_R9 + 1;
        }
        break;
      case 0x3ea:
        local_c8 = (long *)(((in_R9 * (local_e8 - lVar3) + local_e8) - lVar1) * 8 + in_RSI);
        for (local_a0 = 0; local_a0 < (lVar4 - local_e8) + 1; local_a0 = local_a0 + 1) {
          *local_c8 = *(long *)((long)__ptr + local_a0 * 8) + *local_c8;
          local_c8 = local_c8 + in_R9 + 1;
        }
        break;
      case 0x3eb:
        local_b8 = (float *)(((in_R9 * (local_e8 - lVar3) + local_e8) - lVar1) * 4 + in_RSI);
        for (local_a0 = 0; local_a0 < (lVar4 - local_e8) + 1; local_a0 = local_a0 + 1) {
          *local_b8 = *(float *)((long)__ptr + local_a0 * 4) + *local_b8;
          local_b8 = local_b8 + in_R9 + 1;
        }
        break;
      case 0x3ec:
        local_c0 = (double *)(((in_R9 * (local_e8 - lVar3) + local_e8) - lVar1) * 8 + in_RSI);
        for (local_a0 = 0; local_a0 < (lVar4 - local_e8) + 1; local_a0 = local_a0 + 1) {
          *local_c0 = *(double *)((long)__ptr + local_a0 * 8) + *local_c0;
          local_c0 = local_c0 + in_R9 + 1;
        }
        break;
      default:
        pnga_error((char *)lo[0],hi[1]);
        break;
      case 0x3ee:
        local_d8 = (float *)(((in_R9 * (local_e8 - lVar3) + local_e8) - lVar1) * 8 + in_RSI);
        for (local_a0 = 0; local_a0 < (lVar4 - local_e8) + 1; local_a0 = local_a0 + 1) {
          *local_d8 = *(float *)((long)__ptr + local_a0 * 8) + *local_d8;
          local_d8[1] = *(float *)((long)__ptr + local_a0 * 8 + 4) + local_d8[1];
          local_d8 = local_d8 + (in_R9 + 1) * 2;
        }
        break;
      case 0x3ef:
        local_d0 = (double *)(((in_R9 * (local_e8 - lVar3) + local_e8) - lVar1) * 0x10 + in_RSI);
        for (local_a0 = 0; local_a0 < (lVar4 - local_e8) + 1; local_a0 = local_a0 + 1) {
          *local_d0 = *(double *)((long)__ptr + local_a0 * 0x10) + *local_d0;
          local_d0[1] = *(double *)((long)__ptr + local_a0 * 0x10 + 8) + local_d0[1];
          local_d0 = local_d0 + (in_R9 + 1) * 2;
        }
      }
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void sgai_add_diagonal_block(Integer g_a, void *ptr, Integer g_v,
                            Integer *loA, Integer *hiA, Integer ld,
                            Integer type)
{
  Integer nelem, size;
  Integer vlo, vhi, iloA, ihiA, jloA, jhiA, lo[2], hi[2];
  Integer i;
  void *buf;
  int *ia;
  float *fa;
  double *da;
  long *la;
  DoubleComplex *dca;
  SingleComplex *fca;

  iloA = loA[0];
  ihiA = hiA[0];
  jloA = loA[1];
  jhiA = hiA[1];

  /* determine subset of my patch to access */
  if (iloA > 0)
  {
    lo[0] = GA_MAX (iloA, jloA);
    lo[1] = GA_MAX (iloA, jloA);
    hi[0] = GA_MIN (ihiA, jhiA);
    hi[1] = GA_MIN (ihiA, jhiA);



    if (hi[0] >= lo[0]) /*make sure the equality symbol is there!!! */
    {                   /* we got a block containing diagonal elements */

      /*allocate a buffer for the given vector g_v */
      size = GAsizeof (type);
      vlo = GA_MAX (iloA, jloA);
      vhi = GA_MIN (ihiA, jhiA);
      nelem = vhi - vlo + 1;
      buf = malloc (nelem * size);
      if (buf == NULL)
        pnga_error
          ("ga_add_diagonal_:failed to allocate memory for the local buffer.",
           0);

      /* get the vector from the global array to the local memory buffer */
      pnga_get (g_v, &vlo, &vhi, buf, &vhi);

      switch (type)
      {
        case C_INT:
          ia = (int *) ptr;
          ia += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *ia += ((int *) buf)[i];
            ia += ld + 1;
          }
          break;
        case C_LONG:
          la = (long *) ptr;
          la += ld*(lo[1]-jloA) + lo[0]-iloA; 
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *la += ((long *) buf)[i];
            la += ld + 1;
          }
          break;
        case C_FLOAT:
          fa = (float *) ptr;
          fa += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *fa += ((float *) buf)[i];
            fa += ld + 1;
          }
          break;
        case C_DBL:
          da = (double *) ptr;
          da += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *da += ((double *) buf)[i];
            da += ld + 1;
          }
          break;
        case C_DCPL:
          dca = (DoubleComplex *) ptr;
          dca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (*dca).real += (((DoubleComplex *) buf)[i]).real;
            (*dca).imag += (((DoubleComplex *) buf)[i]).imag;
            dca += ld + 1;
          }
          break;

        case C_SCPL:
          fca = (SingleComplex *) ptr;
          fca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (*fca).real += (((SingleComplex *) buf)[i]).real;
            (*fca).imag += (((SingleComplex *) buf)[i]).imag;
            fca += ld + 1;
          }
          break;

        default:
          pnga_error("ga_add_diagonal_: wrong data type:", type);
      }

      /*free the memory */
      free (buf);
    }
  }
}